

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::ValidationContextImpl::isPrefixUnknown(ValidationContextImpl *this,XMLCh *prefix)

{
  XMLCh XVar1;
  XMLCh XVar2;
  ElemStack *this_00;
  uint uVar3;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  byte bVar6;
  bool local_9;
  
  local_9 = false;
  bVar6 = 1;
  if (prefix == L"xmlns") goto LAB_002b5c56;
  pXVar4 = L"xmlns";
  pXVar5 = prefix;
  if (prefix == (XMLCh *)0x0) {
LAB_002b5bdb:
    if (*pXVar4 == L'\0') goto LAB_002b5c56;
  }
  else {
    do {
      XVar1 = *pXVar5;
      if (XVar1 == L'\0') goto LAB_002b5bdb;
      XVar2 = *pXVar4;
      pXVar4 = pXVar4 + 1;
      pXVar5 = pXVar5 + 1;
    } while (XVar1 == XVar2);
  }
  if (prefix != L"xml") {
    pXVar4 = L"xml";
    pXVar5 = prefix;
    if (prefix == (XMLCh *)0x0) {
LAB_002b5c13:
      if (*pXVar4 == L'\0') goto LAB_002b5c54;
    }
    else {
      do {
        XVar1 = *pXVar5;
        if (XVar1 == L'\0') goto LAB_002b5c13;
        XVar2 = *pXVar4;
        pXVar4 = pXVar4 + 1;
        pXVar5 = pXVar5 + 1;
      } while (XVar1 == XVar2);
    }
    this_00 = this->fElemStack;
    if ((this_00 != (ElemStack *)0x0) && (this_00->fStackTop != 0)) {
      ElemStack::mapPrefixToURI(this_00,prefix,&local_9);
      bVar6 = local_9;
      goto LAB_002b5c56;
    }
    if (this->fNamespaceScope != (NamespaceScope *)0x0) {
      uVar3 = (**(this->fNamespaceScope->super_XercesNamespaceResolver).
                 _vptr_XercesNamespaceResolver)();
      bVar6 = uVar3 == this->fNamespaceScope->fEmptyNamespaceId;
      goto LAB_002b5c56;
    }
  }
LAB_002b5c54:
  bVar6 = 0;
LAB_002b5c56:
  return (bool)(bVar6 & 1);
}

Assistant:

bool ValidationContextImpl::isPrefixUnknown(XMLCh* prefix) {
    bool unknown = false;
    if (XMLString::equals(prefix, XMLUni::fgXMLNSString)) {
        return true;
    }
    else if (!XMLString::equals(prefix, XMLUni::fgXMLString)) {
        if(fElemStack && !fElemStack->isEmpty())
            fElemStack->mapPrefixToURI(prefix, unknown);
        else if(fNamespaceScope)
            unknown = (fNamespaceScope->getNamespaceForPrefix(prefix)==fNamespaceScope->getEmptyNamespaceId());
    }
    return unknown;
}